

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseLine
          (EAMAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  RealType RVar7;
  RealType RVar8;
  RealType RVar9;
  RealType RVar10;
  RealType RVar11;
  RealType RVar12;
  RealType RVar13;
  RealType RVar14;
  RealType RVar15;
  RealType RVar16;
  RealType RVar17;
  RealType RVar18;
  RealType RVar19;
  RealType rhoh;
  EAMAdapter ea_00;
  bool bVar20;
  int iVar21;
  int iVar22;
  AtomType *this_00;
  ifstrstream *input;
  long *plVar23;
  pointer pdVar24;
  string *psVar25;
  ifstrstream *this_01;
  int in_R8D;
  vector<double,_std::allocator<double>_> F;
  RealType RStack_10380;
  StringTokenizer tokenizer;
  EAMAdapter ea;
  allocator<char> aStack_102b2;
  allocator<char> aStack_102b1;
  string sStack_102b0;
  RealType RStack_10290;
  vector<double,_std::allocator<double>_> Fn;
  string eamParameterType;
  vector<double,_std::allocator<double>_> F_3;
  _Vector_base<double,_std::allocator<double>_> _Stack_101c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vStack_101b0;
  _Vector_base<double,_std::allocator<double>_> _Stack_10198;
  _Vector_base<double,_std::allocator<double>_> _Stack_10180;
  _Vector_base<double,_std::allocator<double>_> _Stack_10168;
  _Vector_base<double,_std::allocator<double>_> _Stack_10150;
  _Vector_base<double,_std::allocator<double>_> _Stack_10138;
  _Vector_base<double,_std::allocator<double>_> _Stack_10120;
  _Vector_base<double,_std::allocator<double>_> _Stack_10108;
  _Vector_base<double,_std::allocator<double>_> _Stack_100f0;
  string atomTypeName;
  string sStack_100b8;
  string sStack_10098;
  string sStack_10078;
  string sStack_10058;
  string funcflFile;
  
  this->eus_ = (this->options_->MetallicEnergyUnitScaling).data_;
  this->dus_ = (this->options_->DistanceUnitScaling).data_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcflFile," ;\t\n\r",(allocator<char> *)&Fn);
  StringTokenizer::StringTokenizer(&tokenizer,line,&funcflFile);
  std::__cxx11::string::~string((string *)&funcflFile);
  iVar21 = StringTokenizer::countTokens(&tokenizer);
  iVar22 = StringTokenizer::countTokens(&tokenizer);
  if (iVar22 < 2) {
    snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
    goto LAB_0017cdf3;
  }
  StringTokenizer::nextToken_abi_cxx11_(&atomTypeName,&tokenizer);
  StringTokenizer::nextToken_abi_cxx11_(&eamParameterType,&tokenizer);
  this_00 = ForceField::getAtomType(ff,&atomTypeName);
  if (this_00 == (AtomType *)0x0) {
    snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Can not find AtomType [%s]\n",
             atomTypeName._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
    goto LAB_0017cdd9;
  }
  ea.at_ = this_00;
  std::locale::locale((locale *)&funcflFile);
  toUpper<std::__cxx11::string>(&eamParameterType,(locale *)&funcflFile);
  std::locale::~locale((locale *)&funcflFile);
  bVar20 = std::operator==(&eamParameterType,"FUNCFL");
  if (bVar20) {
    StringTokenizer::nextToken_abi_cxx11_(&funcflFile,&tokenizer);
    ea_00 = ea;
    AtomType::getIdent(this_00);
    parseFuncflFile(this,ff,ea_00,&funcflFile,in_R8D);
LAB_0017cdcc:
    psVar25 = &funcflFile;
LAB_0017cdd4:
    std::__cxx11::string::~string((string *)psVar25);
  }
  else {
    bVar20 = std::operator==(&eamParameterType,"ZHOU");
    if (!bVar20) {
      bVar20 = std::operator==(&eamParameterType,"ZHOU2001");
      if (bVar20) goto LAB_0017c91e;
      bVar20 = std::operator==(&eamParameterType,"ZHOU2004");
      if (bVar20) {
        if (0x18 < iVar21) {
          StringTokenizer::nextToken_abi_cxx11_(&funcflFile,&tokenizer);
          std::locale::locale((locale *)&Fn);
          toUpper<std::__cxx11::string>(&funcflFile,(locale *)&Fn);
          std::locale::~locale((locale *)&Fn);
          dVar1 = this->dus_;
          RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar9 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          dVar2 = this->eus_;
          RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          dVar3 = this->eus_;
          RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar15 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&F,(double *)&sStack_102b0);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&F,(double *)&sStack_102b0);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&F,(double *)&sStack_102b0);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&F,(double *)&sStack_102b0);
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RStack_10290 = this->eus_;
          RVar18 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar19 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          rhoh = StringTokenizer::nextTokenAsDouble(&tokenizer);
          std::__cxx11::string::string((string *)&sStack_10078,(string *)&funcflFile);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&_Stack_10120,&Fn);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&_Stack_10138,&F);
          EAMAdapter::makeZhou2004
                    (&ea,&sStack_10078,dVar1 * RVar7,RVar8,RVar9,RVar10,RVar11,RVar12,dVar2 * RVar13
                     ,dVar3 * RVar14,RVar15,RVar16,
                     (vector<double,_std::allocator<double>_> *)&_Stack_10120,
                     (vector<double,_std::allocator<double>_> *)&_Stack_10138,RVar17,
                     RStack_10290 * RVar18,RVar19,rhoh);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10138);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10120);
          psVar25 = &sStack_10078;
          goto LAB_0017cdb0;
        }
        goto LAB_0017c924;
      }
      bVar20 = std::operator==(&eamParameterType,"ZHOU2005");
      if (bVar20) {
        if (0x17 < iVar21) {
          StringTokenizer::nextToken_abi_cxx11_(&funcflFile,&tokenizer);
          std::locale::locale((locale *)&Fn);
          toUpper<std::__cxx11::string>(&funcflFile,(locale *)&Fn);
          std::locale::~locale((locale *)&Fn);
          dVar1 = this->dus_;
          RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar9 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          dVar2 = this->eus_;
          RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          dVar3 = this->eus_;
          RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar15 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&F,(double *)&sStack_102b0);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&F,(double *)&sStack_102b0);
          dVar4 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&F,(double *)&sStack_102b0);
          dVar4 = this->eus_;
          RStack_10290 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          dVar5 = this->eus_;
          RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          RVar18 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          dVar6 = this->eus_;
          RVar19 = StringTokenizer::nextTokenAsDouble(&tokenizer);
          std::__cxx11::string::string((string *)&sStack_10098,(string *)&funcflFile);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&_Stack_10150,&Fn);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&_Stack_10168,&F);
          EAMAdapter::makeZhou2005
                    (&ea,&sStack_10098,dVar1 * RVar7,RVar8,RVar9,RVar10,RVar11,RVar12,dVar2 * RVar13
                     ,dVar3 * RVar14,RVar15,RVar16,
                     (vector<double,_std::allocator<double>_> *)&_Stack_10150,
                     (vector<double,_std::allocator<double>_> *)&_Stack_10168,dVar4 * RStack_10290,
                     dVar5 * RVar17,RVar18,dVar6 * RVar19);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10168);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10150);
          psVar25 = &sStack_10098;
          goto LAB_0017cdb0;
        }
        goto LAB_0017c924;
      }
      bVar20 = std::operator==(&eamParameterType,"ZHOU2005OXYGEN");
      if (bVar20) {
        if (iVar21 < 0x26) goto LAB_0017c924;
        dVar1 = this->dus_;
        RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar9 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        dVar2 = this->eus_;
        RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        dVar3 = this->eus_;
        RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar15 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        funcflFile._M_dataplus._M_p = (pointer)0x0;
        funcflFile._M_string_length = 0;
        funcflFile.field_2._M_allocated_capacity = 0;
        Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&funcflFile,(double *)&Fn);
        Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&funcflFile,(double *)&Fn);
        Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&funcflFile,(double *)&Fn);
        Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&funcflFile,(double *)&Fn);
        Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&funcflFile,(double *)&Fn);
        Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
        F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
        F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
        F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
        F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
        F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&F,5);
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)pdVar24,(double *)&sStack_102b0);
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)pdVar24,(double *)&sStack_102b0);
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)pdVar24,(double *)&sStack_102b0);
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)pdVar24,(double *)&sStack_102b0);
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 3),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 3),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 3),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 6),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 6),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 6),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 9),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 9),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 9),(double *)&sStack_102b0)
        ;
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 0xc),
                   (double *)&sStack_102b0);
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 0xc),
                   (double *)&sStack_102b0);
        pdVar24 = F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar4 = this->eus_;
        RVar17 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar17);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)(pdVar24 + 0xc),
                   (double *)&sStack_102b0);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&_Stack_10180,
                   (vector<double,_std::allocator<double>_> *)&funcflFile);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&_Stack_10198,&Fn);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&vStack_101b0,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&F);
        EAMAdapter::makeZhou2005Oxygen
                  (&ea,dVar1 * RVar7,RVar8,RVar9,RVar10,dVar2 * RVar11,dVar3 * RVar12,RVar13,RVar14,
                   RVar15,RVar16,(vector<double,_std::allocator<double>_> *)&_Stack_10180,
                   (vector<double,_std::allocator<double>_> *)&_Stack_10198,&vStack_101b0);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&vStack_101b0);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10198);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10180);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&F);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&Fn.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&funcflFile);
        goto LAB_0017cdd9;
      }
      bVar20 = std::operator==(&eamParameterType,"ZHOUROSE");
      if (bVar20) {
        if (iVar21 < 0xc) goto LAB_0017c924;
        dVar1 = this->dus_;
        RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar9 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        dVar2 = this->eus_;
        RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        dVar3 = this->eus_;
        RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        RVar15 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        dVar4 = this->eus_;
        RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        EAMAdapter::makeZhouRose
                  (&ea,dVar1 * RVar7,RVar8,RVar9,RVar10,RVar11,dVar2 * RVar12,dVar3 * RVar13,RVar14,
                   RVar15,dVar4 * RVar16);
        goto LAB_0017cdd9;
      }
      bVar20 = std::operator==(&eamParameterType,"OXYFUNCFL");
      if (!bVar20) {
        snprintf(painCave.errMsg,2000,
                 "EAMAtomTypesSectionParser Error: %s is not a recognized EAM type\n",
                 eamParameterType._M_dataplus._M_p);
        goto LAB_0017c940;
      }
      if (iVar21 < 0xb) goto LAB_0017c924;
      StringTokenizer::nextToken_abi_cxx11_((string *)&F,&tokenizer);
      dVar1 = this->dus_;
      RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar9 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar2 = this->eus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar3 = this->eus_;
      RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      input = ForceField::openForceFieldFile(ff,(string *)&F);
      std::istream::getline((char *)input,(long)&funcflFile);
      F_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      F_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      F_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      this_01 = input;
      plVar23 = (long *)std::istream::getline((char *)input,(long)&funcflFile);
      if ((*(byte *)((long)plVar23 + *(long *)(*plVar23 + -0x18) + 0x20) & 5) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_102b0,(char *)&funcflFile,&aStack_102b1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_100b8," ;\t\n\r",&aStack_102b2);
        StringTokenizer::StringTokenizer((StringTokenizer *)&Fn,&sStack_102b0,&sStack_100b8);
        std::__cxx11::string::~string((string *)&sStack_100b8);
        std::__cxx11::string::~string((string *)&sStack_102b0);
        iVar21 = StringTokenizer::countTokens((StringTokenizer *)&Fn);
        if (iVar21 == 2) {
          iVar21 = StringTokenizer::nextTokenAsInt((StringTokenizer *)&Fn);
          RStack_10380 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)&Fn);
        }
        else {
          builtin_strncpy(painCave.errMsg,"EAMAtomTypesSectionParser Error: Not enough tokens\n",
                          0x34);
          painCave.isFatal = 1;
          simError();
          iVar21 = 0;
          RStack_10380 = 0.0;
        }
        this_01 = (ifstrstream *)&Fn;
        StringTokenizer::~StringTokenizer((StringTokenizer *)this_01);
      }
      else {
        iVar21 = 0;
        RStack_10380 = 0.0;
      }
      parseEAMArray((EAMAtomTypesSectionParser *)this_01,
                    &input->super_basic_istream<char,_std::char_traits<char>_>,&F_3,iVar21);
      (*(input->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[1])(input);
      dVar4 = this->eus_;
      for (pdVar24 = F_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar24 !=
          F_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish; pdVar24 = pdVar24 + 1) {
        *pdVar24 = *pdVar24 * dVar4;
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&_Stack_101c8,&F_3);
      EAMAdapter::makeOxygenFuncfl
                (&ea,dVar1 * RVar7,RVar8,RVar9,RVar10,dVar2 * RVar11,dVar3 * RVar12,RVar13,RVar14,
                 RStack_10380,(double)iVar21,
                 (vector<double,_std::allocator<double>_> *)&_Stack_101c8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_101c8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&F_3.super__Vector_base<double,_std::allocator<double>_>);
      psVar25 = (string *)&F;
      goto LAB_0017cdd4;
    }
LAB_0017c91e:
    if (0x15 < iVar21) {
      StringTokenizer::nextToken_abi_cxx11_(&funcflFile,&tokenizer);
      std::locale::locale((locale *)&Fn);
      toUpper<std::__cxx11::string>(&funcflFile,(locale *)&Fn);
      std::locale::~locale((locale *)&Fn);
      dVar1 = this->dus_;
      RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar9 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar2 = this->eus_;
      RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar3 = this->eus_;
      RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar15 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      dVar4 = this->eus_;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)(dVar4 * RVar16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
      dVar4 = this->eus_;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)(dVar4 * RVar16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
      dVar4 = this->eus_;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)(dVar4 * RVar16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
      dVar4 = this->eus_;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)(dVar4 * RVar16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&Fn,(double *)&F);
      F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      dVar4 = this->eus_;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&F,(double *)&sStack_102b0)
      ;
      dVar4 = this->eus_;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&F,(double *)&sStack_102b0)
      ;
      dVar4 = this->eus_;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&F,(double *)&sStack_102b0)
      ;
      dVar4 = this->eus_;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      sStack_102b0._M_dataplus._M_p = (pointer)(dVar4 * RVar16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&F,(double *)&sStack_102b0)
      ;
      RVar16 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar4 = this->eus_;
      RStack_10290 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      std::__cxx11::string::string((string *)&sStack_10058,(string *)&funcflFile);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&_Stack_100f0,&Fn);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&_Stack_10108,&F);
      EAMAdapter::makeZhou2001
                (&ea,&sStack_10058,dVar1 * RVar7,RVar8,RVar9,RVar10,RVar11,dVar2 * RVar12,
                 dVar3 * RVar13,RVar14,RVar15,
                 (vector<double,_std::allocator<double>_> *)&_Stack_100f0,
                 (vector<double,_std::allocator<double>_> *)&_Stack_10108,RVar16,
                 dVar4 * RStack_10290);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10108);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_100f0);
      psVar25 = &sStack_10058;
LAB_0017cdb0:
      std::__cxx11::string::~string((string *)psVar25);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&F.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&Fn.super__Vector_base<double,_std::allocator<double>_>);
      goto LAB_0017cdcc;
    }
LAB_0017c924:
    snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
LAB_0017c940:
    painCave.isFatal = 1;
    simError();
  }
LAB_0017cdd9:
  std::__cxx11::string::~string((string *)&eamParameterType);
  std::__cxx11::string::~string((string *)&atomTypeName);
LAB_0017cdf3:
  StringTokenizer::~StringTokenizer(&tokenizer);
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseLine(ForceField& ff, const string& line,
                                            int lineNo) {
    eus_ = options_.getMetallicEnergyUnitScaling();
    dus_ = options_.getDistanceUnitScaling();

    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (tokenizer.countTokens() >= 2) {
      std::string atomTypeName     = tokenizer.nextToken();
      std::string eamParameterType = tokenizer.nextToken();
      nTokens -= 2;
      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        EAMAdapter ea = EAMAdapter(atomType);
        toUpper(eamParameterType);

        if (eamParameterType == "FUNCFL") {
          std::string funcflFile = tokenizer.nextToken();
          parseFuncflFile(ff, ea, funcflFile, atomType->getIdent());
        } else if (eamParameterType == "ZHOU" ||
                   eamParameterType == "ZHOU2001") {
          if (nTokens < 20) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType eta = tokenizer.nextTokenAsDouble();
            RealType Fe  = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhou2001(lattice, re, fe, rhoe, alpha, beta, A, B, kappa,
                            lambda, Fn, F, eta, Fe);
          }
        } else if (eamParameterType == "ZHOU2004") {
          if (nTokens < 23) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType rhos   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType eta  = tokenizer.nextTokenAsDouble();
            RealType Fe   = eus_ * tokenizer.nextTokenAsDouble();
            RealType rhol = tokenizer.nextTokenAsDouble();
            RealType rhoh = tokenizer.nextTokenAsDouble();

            ea.makeZhou2004(lattice, re, fe, rhoe, rhos, alpha, beta, A, B,
                            kappa, lambda, Fn, F, eta, Fe, rhol, rhoh);
          }

        } else if (eamParameterType == "ZHOU2005") {
          if (nTokens < 22) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType rhos   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType F3minus = eus_ * tokenizer.nextTokenAsDouble();
            RealType F3plus  = eus_ * tokenizer.nextTokenAsDouble();
            RealType eta     = tokenizer.nextTokenAsDouble();
            RealType Fe      = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhou2005(lattice, re, fe, rhoe, rhos, alpha, beta, A, B,
                            kappa, lambda, Fn, F, F3minus, F3plus, eta, Fe);
          }
        } else if (eamParameterType == "ZHOU2005OXYGEN") {
          if (nTokens < 36) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            RealType gamma  = tokenizer.nextTokenAsDouble();
            RealType nu     = tokenizer.nextTokenAsDouble();

            std::vector<RealType> OrhoLimits;
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());

            std::vector<RealType> OrhoE;
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());

            std::vector<std::vector<RealType>> OF;
            OF.resize(5);
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());

            ea.makeZhou2005Oxygen(re, fe, alpha, beta, A, B, kappa, lambda,
                                  gamma, nu, OrhoLimits, OrhoE, OF);
          }
        } else if (eamParameterType == "ZHOUROSE") {
          if (nTokens < 10) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            RealType F0     = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhouRose(re, fe, rhoe, alpha, beta, A, B, kappa, lambda, F0);
          }
        } else if (eamParameterType == "OXYFUNCFL") {
          if (nTokens < 9) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string funcflFile = tokenizer.nextToken();

            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();

            ifstrstream* ppfStream = ff.openForceFieldFile(funcflFile);
            const int bufferSize   = 65535;
            char buffer[bufferSize];

            // skip first line
            ppfStream->getline(buffer, bufferSize);

            std::vector<RealType> F;

            int nrho      = 0;
            RealType drho = 0.0;
            if (ppfStream->getline(buffer, bufferSize)) {
              StringTokenizer tokenizer1(buffer);

              if (tokenizer1.countTokens() == 2) {
                nrho = tokenizer1.nextTokenAsInt();
                drho = tokenizer1.nextTokenAsDouble();
              } else {
                snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                         "EAMAtomTypesSectionParser Error: "
                         "Not enough tokens\n");
                painCave.isFatal = 1;
                simError();
              }
            }

            parseEAMArray(*ppfStream, F, nrho);
            delete ppfStream;

            // Convert to eV using energy unit scaling in force field:
            std::transform(F.begin(), F.end(), F.begin(),
                           std::bind(std::multiplies<RealType>(), eus_,
                                     std::placeholders::_1));

            ea.makeOxygenFuncfl(re, fe, alpha, beta, A, B, kappa, lambda, drho,
                                nrho, F);
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAMAtomTypesSectionParser Error: %s "
                   "is not a recognized EAM type\n",
                   eamParameterType.c_str());
          painCave.isFatal = 1;
          simError();
        }

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Can not find AtomType [%s]\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }